

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result wabt::interp::ReadBinaryInterp
                 (void *data,size_t size,ReadBinaryOptions *options,Errors *errors,
                 ModuleDesc *out_module)

{
  Result RVar1;
  BinaryReaderInterp reader;
  Features local_3d0;
  BinaryReaderDelegate local_3c0;
  Errors *local_3b0;
  ModuleDesc *local_3a8;
  Istream *local_3a0;
  SharedValidator local_398;
  void *local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_128;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_f8;
  vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_> local_a8;
  vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_> vStack_90;
  vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_> local_78;
  vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_> vStack_60;
  vector<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_> local_48;
  
  local_3c0.state = (State *)0x0;
  local_3c0._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderInterp_001e3f28;
  local_3a0 = &out_module->istream;
  local_3d0.bulk_memory_enabled_ = (options->features).bulk_memory_enabled_;
  local_3d0.reference_types_enabled_ = (options->features).reference_types_enabled_;
  local_3d0.annotations_enabled_ = (options->features).annotations_enabled_;
  local_3d0.gc_enabled_ = (options->features).gc_enabled_;
  local_3d0.exceptions_enabled_ = (options->features).exceptions_enabled_;
  local_3d0.mutable_globals_enabled_ = (options->features).mutable_globals_enabled_;
  local_3d0.sat_float_to_int_enabled_ = (options->features).sat_float_to_int_enabled_;
  local_3d0.sign_extension_enabled_ = (options->features).sign_extension_enabled_;
  local_3d0.simd_enabled_ = (options->features).simd_enabled_;
  local_3d0.threads_enabled_ = (options->features).threads_enabled_;
  local_3d0.multi_value_enabled_ = (options->features).multi_value_enabled_;
  local_3d0.tail_call_enabled_ = (options->features).tail_call_enabled_;
  local_3b0 = errors;
  local_3a8 = out_module;
  SharedValidator::SharedValidator(&local_398,errors,(ValidateOptions *)&local_3d0);
  local_140 = (void *)0x0;
  uStack_138 = 0;
  local_130 = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_90.super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_90.super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_90.super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_60.super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_60.super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_60.super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar1 = ReadBinary(data,size,&local_3c0,options);
  local_3c0._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderInterp_001e3f28;
  std::vector<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>::~vector(&local_48)
  ;
  std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::~vector
            (&vStack_60);
  std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::~vector
            (&local_78);
  std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::~vector
            (&vStack_90);
  std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::~vector(&local_a8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase(&local_f8,(_Link_type)local_f8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase(&local_128,(_Link_type)local_128._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_140 != (void *)0x0) {
    operator_delete(local_140);
  }
  SharedValidator::~SharedValidator(&local_398);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryInterp(const void* data,
                        size_t size,
                        const ReadBinaryOptions& options,
                        Errors* errors,
                        ModuleDesc* out_module) {
  BinaryReaderInterp reader(out_module, errors, options.features);
  return ReadBinary(data, size, &reader, options);
}